

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexVerifierUtil.cpp
# Opt level: O0

Vec2 __thiscall
tcu::TexVerifierUtil::computeNonNormalizedCoordBounds
          (TexVerifierUtil *this,bool normalizedCoords,int dim,float coord,int coordBits,int uvBits)

{
  Vec2 VVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  float local_58;
  float maxC;
  float minC;
  float maxA;
  float minA;
  float maxN;
  float minN;
  float coordErr;
  int uvBits_local;
  int coordBits_local;
  float coord_local;
  int dim_local;
  bool normalizedCoords_local;
  
  local_58 = computeFloatingPointError(coord,coordBits);
  fVar2 = coord - local_58;
  local_58 = coord + local_58;
  if (normalizedCoords) {
    fVar2 = fVar2 * (float)dim;
    local_58 = local_58 * (float)dim;
  }
  fVar3 = computeFixedPointError(uvBits);
  fVar4 = computeFixedPointError(uvBits);
  Vector<float,_2>::Vector((Vector<float,_2> *)this,fVar2 - fVar3,local_58 + fVar4);
  VVar1.m_data[1] = extraout_XMM0_Db;
  VVar1.m_data[0] = extraout_XMM0_Da;
  return (Vec2)VVar1.m_data;
}

Assistant:

Vec2 computeNonNormalizedCoordBounds (const bool normalizedCoords, const int dim, const float coord, const int coordBits, const int uvBits)
{
	const float		coordErr		= computeFloatingPointError(coord, coordBits);
	const float		minN			= coord - coordErr;
	const float		maxN			= coord + coordErr;
	const float		minA			= normalizedCoords ? minN*float(dim) : minN;
	const float		maxA			= normalizedCoords ? maxN*float(dim) : maxN;
	const float		minC			= minA - computeFixedPointError(uvBits);
	const float		maxC			= maxA + computeFixedPointError(uvBits);

	DE_ASSERT(minC <= maxC);

	return Vec2(minC, maxC);
}